

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# use_move_semantics.cpp
# Opt level: O2

Useless * __thiscall L18_1::Useless::operator=(Useless *this,Useless *f)

{
  std::operator<<((ostream *)&std::cout,"move assignment operator called:\n");
}

Assistant:

Useless& Useless::operator=(L18_1::Useless &&f) {
        cout << "move assignment operator called:\n";
        //  wtf could this be same?
        if (this == &f) {
            return * this;
        }

        delete [] pc;
        n = f.n;
        //  transfer ownership
        pc = f.pc;

        //  clear f's content
        f.n = 0;
        f.pc = nullptr;
        return *this;
    }